

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_decompress.c
# Opt level: O1

size_t ZSTD_DCtx_setFormat(ZSTD_DCtx *dctx,ZSTD_format_e format)

{
  size_t sVar1;
  
  sVar1 = 0xffffffffffffffc4;
  if ((dctx->streamStage == zdss_init) && (sVar1 = 0xffffffffffffffd6, format < 2)) {
    dctx->format = format;
    return 0;
  }
  return sVar1;
}

Assistant:

size_t ZSTD_DCtx_setFormat(ZSTD_DCtx* dctx, ZSTD_format_e format)
{
    return ZSTD_DCtx_setParameter(dctx, ZSTD_d_format, (int)format);
}